

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-def.cpp
# Opt level: O0

void __thiscall JitFFI::JitFuncCallerCreaterX64::call_func(JitFuncCallerCreaterX64 *this,void *func)

{
  void *func_local;
  JitFuncCallerCreaterX64 *this_local;
  
  OpCode_x64::movq_u64(this->data,rax,(uint64_t)func);
  OpCode_x64::call_rax(this->data);
  return;
}

Assistant:

void JitFuncCallerCreaterX64::call_func(void *func) {
		OpCode_x64::movq_u64(data, OpCode_x64::rax, reinterpret_cast<uint64_t>(func));
		OpCode_x64::call_rax(data);
	}